

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

maxint_t * primecount::S1(maxint_t x,int threads)

{
  long lVar1;
  undefined1 n [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  bool bVar2;
  maxint_t *pmVar3;
  undefined8 uVar4;
  __int128 *p_Var5;
  long c_00;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  long in_RSI;
  maxint_t *in_RDI;
  double dVar6;
  double dVar7;
  int64_t c;
  int64_t y;
  maxint_t limit;
  double alpha;
  string *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffec8;
  int64_t in_stack_fffffffffffffed0;
  int64_t in_stack_fffffffffffffed8;
  int64_t in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined1 in_stack_ffffffffffffff1b;
  int in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  int128_t *local_18;
  
  if (-in_RSI < (long)(ulong)(in_RDI != (maxint_t *)0x0)) {
    x_01._8_8_ = in_stack_fffffffffffffee8;
    x_01._0_8_ = in_stack_fffffffffffffee0;
    dVar6 = get_alpha_deleglise_rivat((maxint_t)x_01);
    pmVar3 = get_max_x((double)in_stack_fffffffffffffe68);
    if ((SBORROW8(extraout_RDX,in_RSI) != SBORROW8(extraout_RDX - in_RSI,(ulong)(pmVar3 < in_RDI)))
        != (long)((extraout_RDX - in_RSI) - (ulong)(pmVar3 < in_RDI)) < 0) {
      uVar4 = __cxa_allocate_exception(0x10,in_RDI,(long)pmVar3 - (long)in_RDI);
      n._8_8_ = in_stack_fffffffffffffed8;
      n._0_8_ = in_stack_fffffffffffffed0;
      to_string_abi_cxx11_((int128_t)n);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      primecount_error::primecount_error
                ((primecount_error *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      __cxa_throw(uVar4,&primecount_error::typeinfo,primecount_error::~primecount_error);
    }
    bVar2 = is_print();
    if (bVar2) {
      set_print_variables(true);
    }
    x_00._8_8_ = in_stack_fffffffffffffed8;
    x_00._0_8_ = in_stack_fffffffffffffed0;
    p_Var5 = (anonymous_namespace)::iroot<3,__int128>((__int128)x_00);
    dVar7 = (double)__floattidf(p_Var5,extraout_RDX_00);
    c_00 = (long)(dVar7 * dVar6);
    PhiTiny::get_c((uint64_t)in_stack_fffffffffffffe68);
    pmVar3 = (maxint_t *)anon_unknown.dwarf_9c22::pstd::numeric_limits<long>::max();
    lVar1 = ((long)pmVar3 >> 0x3f) - in_RSI;
    if ((SBORROW8((long)pmVar3 >> 0x3f,in_RSI) != SBORROW8(lVar1,(ulong)(pmVar3 < in_RDI))) ==
        (long)(lVar1 - (ulong)(pmVar3 < in_RDI)) < 0) {
      is_print();
      local_18 = (int128_t *)
                 S1(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                    (int)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                    SUB81((ulong)in_stack_fffffffffffffec8 >> 0x18,0));
    }
    else {
      is_print();
      x_02._8_8_ = in_stack_ffffffffffffff38;
      x_02._0_8_ = in_stack_ffffffffffffff30;
      local_18 = S1((int128_t)x_02,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    c_00,in_stack_ffffffffffffff1c,(bool)in_stack_ffffffffffffff1b);
    }
  }
  else {
    local_18 = (int128_t *)0x0;
  }
  return local_18;
}

Assistant:

maxint_t S1(maxint_t x, int threads)
{
  if (x < 1)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  maxint_t limit = get_max_x(alpha);

  if (x > limit)
    throw primecount_error("S1(x): x must be <= " + to_string(limit));

  if (is_print())
    set_print_variables(true);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t c = PhiTiny::get_c(y);

  if (x <= pstd::numeric_limits<int64_t>::max())
    return S1((int64_t) x, y, c, threads);
  else
    return S1(x, y, c, threads);
}